

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptArray::ToLocaleString<Js::JavascriptArray>
          (JavascriptArray *arr,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  ThreadContext *threadContext;
  JavascriptLibrary *pJVar3;
  TypedArrayBase *local_e0;
  anon_class_24_3_633237ca local_c0;
  anon_class_48_6_399da0b0 local_a8;
  bool local_71;
  JavascriptArray *pJStack_70;
  bool pushedObject;
  JavascriptString *res;
  TypedArrayBase *local_60;
  TypedArrayBase *typedArray;
  uint32 length;
  undefined1 local_48 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  JavascriptArray *arr_local;
  ScriptContext *local_10;
  
  jsReentLock._24_8_ = scriptContext;
  scriptContext_local = (ScriptContext *)arr;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_48,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_48,scriptContext_local);
  typedArray._0_4_ = 0;
  local_10 = scriptContext_local;
  bVar1 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)scriptContext_local);
  if (bVar1) {
    local_e0 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)local_10);
  }
  else {
    local_e0 = (TypedArrayBase *)0x0;
  }
  local_60 = local_e0;
  if (local_e0 == (TypedArrayBase *)0x0) {
    JsReentLock::unlock((JsReentLock *)local_48);
    typedArray._0_4_ =
         ItemTrace<Js::JavascriptArray>::GetLength
                   ((JavascriptArray *)scriptContext_local,(ScriptContext *)jsReentLock._24_8_);
    JsReentLock::MutateArrayObject((JsReentLock *)local_48);
    JsReentLock::relock((JsReentLock *)local_48);
  }
  else {
    typedArray._0_4_ = ArrayObject::GetLength((ArrayObject *)local_e0);
  }
  if ((uint32)typedArray != 0) {
    BVar2 = ScriptContext::CheckObject((ScriptContext *)jsReentLock._24_8_,scriptContext_local);
    if (BVar2 == 0) {
      pJVar3 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
      pJStack_70 = (JavascriptArray *)JavascriptLibrary::GetEmptyString(pJVar3);
      local_71 = false;
      local_c0.scriptContext = (ScriptContext **)&jsReentLock.m_savedNoJsReentrancy;
      local_c0.arr = (JavascriptArray **)&scriptContext_local;
      local_c0.pushedObject = &local_71;
      local_a8.jsReentLock = (JsReentLock *)local_48;
      local_a8.res = (JavascriptString **)&stack0xffffffffffffff90;
      local_a8.length = (uint32 *)&typedArray;
      local_a8.scriptContext = local_c0.scriptContext;
      local_a8.arr = local_c0.arr;
      local_a8.pushedObject = local_c0.pushedObject;
      TryFinally<Js::JavascriptArray::ToLocaleString<Js::JavascriptArray>(Js::JavascriptArray*,Js::ScriptContext*)::_lambda()_1_,Js::JavascriptArray::ToLocaleString<Js::JavascriptArray>(Js::JavascriptArray*,Js::ScriptContext*)::_lambda(bool)_1_>
                (&local_a8,&local_c0);
      if (pJStack_70 == (JavascriptArray *)0x0) {
        pJVar3 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
        pJStack_70 = (JavascriptArray *)JavascriptLibrary::GetEmptyString(pJVar3);
      }
      arr_local = pJStack_70;
      goto LAB_010fc7ae;
    }
  }
  pJVar3 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
  arr_local = (JavascriptArray *)JavascriptLibrary::GetEmptyString(pJVar3);
LAB_010fc7ae:
  res._4_4_ = 1;
  JsReentLock::~JsReentLock((JsReentLock *)local_48);
  return (JavascriptString *)arr_local;
}

Assistant:

JavascriptString* JavascriptArray::ToLocaleString(T* arr, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        uint32 length = 0;
        TypedArrayBase * typedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(static_cast<RecyclableObject*>(arr));
        if (typedArray)
        {
            // For a TypedArray use the actual length of the array.
            length = typedArray->GetLength();
        }
        else
        {
            //For anything else, use the "length" property if present.
            JS_REENTRANT(jsReentLock, length = ItemTrace<T>::GetLength(arr, scriptContext));
        }

        if (length == 0 || scriptContext->CheckObject(arr))
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        JavascriptString* res = scriptContext->GetLibrary()->GetEmptyString();
        bool pushedObject = false;

        TryFinally([&]()
        {
            scriptContext->PushObject(arr);
            pushedObject = true;

            Var element;
            JS_REENTRANT(jsReentLock, BOOL gotItem = ItemTrace<T>::GetItem(arr, 0, &element, scriptContext));
            if (gotItem)
            {
                JS_REENTRANT(jsReentLock, res = JavascriptArray::ToLocaleStringHelper(element, scriptContext));
            }

            if (length > 1)
            {
                uint32 sepSize = 0;
                char16 szSeparator[Arrays::SeparatorBufferSize];

                bool hasLocaleSeparator = Arrays::GetLocaleSeparator(szSeparator, &sepSize, Arrays::SeparatorBufferSize);

                JavascriptString* separator = nullptr;

                if (hasLocaleSeparator)
                {
                    separator = JavascriptString::NewCopyBuffer(szSeparator, static_cast<charcount_t>(sepSize), scriptContext);
                }
                else
                {
                    separator = scriptContext->GetLibrary()->GetCommaDisplayString();
                }

                for (uint32 i = 1; i < length; i++)
                {
                    res = JavascriptString::Concat(res, separator);
                    JS_REENTRANT(jsReentLock, gotItem = ItemTrace<T>::GetItem(arr, i, &element, scriptContext));
                    if (gotItem)
                    {
                        JS_REENTRANT(jsReentLock, res = JavascriptString::Concat(res, JavascriptArray::ToLocaleStringHelper(element, scriptContext)));
                    }
                }
            }
        },
        [&](bool/*hasException*/)
        {
            if (pushedObject)
            {
                Var top = scriptContext->PopObject();
                AssertMsg(top == arr, "Unmatched operation stack");
            }
        });

        if (res == nullptr)
        {
            res = scriptContext->GetLibrary()->GetEmptyString();
        }

        return res;
    }